

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uuid.hpp
# Opt level: O2

string * uuid::gen_uuid_abi_cxx11_(void)

{
  result_type_conflict1 rVar1;
  string *in_RDI;
  int iVar2;
  bool bVar3;
  stringstream local_1b8 [8];
  stringstream ss;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
  iVar2 = 8;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen);
    std::ostream::operator<<((ostream *)local_1a8,rVar1);
  }
  std::operator<<((ostream *)local_1a8,"-");
  iVar2 = 4;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen);
    std::ostream::operator<<((ostream *)local_1a8,rVar1);
  }
  std::operator<<((ostream *)local_1a8,"-4");
  iVar2 = 3;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen);
    std::ostream::operator<<((ostream *)local_1a8,rVar1);
  }
  std::operator<<((ostream *)local_1a8,"-");
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&dis2,
                     (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                      *)gen);
  std::ostream::operator<<((ostream *)local_1a8,rVar1);
  iVar2 = 3;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen);
    std::ostream::operator<<((ostream *)local_1a8,rVar1);
  }
  std::operator<<((ostream *)local_1a8,"-");
  iVar2 = 0xc;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    rVar1 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&dis,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)gen);
    std::ostream::operator<<((ostream *)local_1a8,rVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return in_RDI;
}

Assistant:

static std::string gen_uuid() {
  std::stringstream ss;
  int i;
  ss << std::hex;
  for (i = 0; i < 8; i++) {
    ss << dis(gen);
  }
  ss << "-";
  for (i = 0; i < 4; i++) {
    ss << dis(gen);
  }
  ss << "-4";
  for (i = 0; i < 3; i++) {
    ss << dis(gen);
  }
  ss << "-";
  ss << dis2(gen);
  for (i = 0; i < 3; i++) {
    ss << dis(gen);
  }
  ss << "-";
  for (i = 0; i < 12; i++) {
    ss << dis(gen);
  }
  return ss.str();
}